

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O0

bool __thiscall
ODDLParser::OpenDDLExport::exportContext(OpenDDLExport *this,Context *ctx,string *filename)

{
  DDLNode *node;
  uint uVar1;
  ulong uVar2;
  bool retValue;
  DDLNode *root;
  string *filename_local;
  Context *ctx_local;
  OpenDDLExport *this_local;
  
  if (ctx == (Context *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    node = ctx->m_root;
    if (node == (DDLNode *)0x0) {
      this_local._7_1_ = true;
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if (((uVar2 & 1) == 0) &&
         (uVar1 = (*this->m_stream->_vptr_IOStreamBase[2])(this->m_stream,filename),
         (uVar1 & 1) == 0)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = handleNode(this,node);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OpenDDLExport::exportContext( Context *ctx, const std::string &filename ) {
    if( ddl_nullptr == ctx ) {
        return false;
    }

    DDLNode *root( ctx->m_root );
    if ( ddl_nullptr == root ) {
        return true;
    }

    if (!filename.empty()) {
        if (!m_stream->open( filename )) {
            return false;
        }
    }

    const bool retValue( handleNode( root ) );
    
    return retValue;
}